

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O1

bool doctest::operator>(double lhs,Approx *rhs)

{
  double dVar1;
  double dVar2;
  
  dVar1 = rhs->m_value;
  if (dVar1 < lhs) {
    dVar2 = ABS(dVar1);
    if (ABS(dVar1) <= ABS(lhs)) {
      dVar2 = ABS(lhs);
    }
    return (dVar2 + rhs->m_scale) * rhs->m_epsilon <= ABS(lhs - dVar1);
  }
  return false;
}

Assistant:

bool operator>(double lhs, const Approx& rhs) { return lhs > rhs.m_value && lhs != rhs; }